

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDiffReporter.cpp
# Opt level: O1

void __thiscall
ApprovalTests::TextDiffReporter::TextDiffReporter(TextDiffReporter *this,ostream *stream)

{
  Reporter *pRVar1;
  FirstWorkingReporter *this_00;
  long lVar2;
  initializer_list<std::shared_ptr<ApprovalTests::Reporter>_> __l;
  vector<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
  reporters;
  allocator_type local_c9;
  undefined8 local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c0;
  element_type *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  shared_ptr<ApprovalTests::Reporter> local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  vector<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
  local_88;
  string local_70;
  string local_50;
  
  (this->super_Reporter)._vptr_Reporter = (_func_int **)&PTR__TextDiffReporter_001ac8f8;
  (this->m_reporter)._M_t.
  super___uniq_ptr_impl<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>._M_t
  .super__Tuple_impl<0UL,_ApprovalTests::Reporter_*,_std::default_delete<ApprovalTests::Reporter>_>.
  super__Head_base<0UL,_ApprovalTests::Reporter_*,_false>._M_head_impl = (Reporter *)0x0;
  this->stream_ = stream;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"diff","");
  CustomReporter::createForegroundReporter((CustomReporter *)&local_b8,&local_50,TEXT,true);
  local_a8.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_b8
  ;
  local_a8.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Stack_b0;
  local_b8 = (element_type *)0x0;
  p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"C:/Windows/System32/fc.exe","");
  CustomReporter::createForegroundReporter
            ((CustomReporter *)&local_c8,&local_70,TEXT_AND_IMAGE,true);
  local_98 = local_c8;
  uStack_90 = p_Stack_c0;
  local_c8 = 0;
  p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __l._M_len = 2;
  __l._M_array = &local_a8;
  ::std::
  vector<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
  ::vector(&local_88,__l,&local_c9);
  lVar2 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&p_Stack_b0 + lVar2) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&p_Stack_b0 + lVar2));
    }
    lVar2 = lVar2 + -0x10;
  } while (lVar2 != 0);
  if (p_Stack_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  this_00 = (FirstWorkingReporter *)operator_new(0x20);
  FirstWorkingReporter::FirstWorkingReporter(this_00,&local_88);
  pRVar1 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_ApprovalTests::Reporter_*,_std::default_delete<ApprovalTests::Reporter>_>
           .super__Head_base<0UL,_ApprovalTests::Reporter_*,_false>._M_head_impl;
  (this->m_reporter)._M_t.
  super___uniq_ptr_impl<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>._M_t
  .super__Tuple_impl<0UL,_ApprovalTests::Reporter_*,_std::default_delete<ApprovalTests::Reporter>_>.
  super__Head_base<0UL,_ApprovalTests::Reporter_*,_false>._M_head_impl = (Reporter *)this_00;
  if (pRVar1 != (Reporter *)0x0) {
    (*pRVar1->_vptr_Reporter[1])();
  }
  ::std::
  vector<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
  ::~vector(&local_88);
  return;
}

Assistant:

TextDiffReporter::TextDiffReporter(std::ostream& stream) : stream_(stream)
    {
        std::vector<std::shared_ptr<Reporter>> reporters = {
            CustomReporter::createForegroundReporter("diff", Type::TEXT, true),
            CustomReporter::createForegroundReporter(
                "C:/Windows/System32/fc.exe", Type::TEXT_AND_IMAGE, true)};
        m_reporter = std::unique_ptr<Reporter>(new FirstWorkingReporter(reporters));
    }